

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O0

void __thiscall
helics::ConnectorFederateManager::~ConnectorFederateManager(ConnectorFederateManager *this)

{
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  ::~shared_guarded_opt
            ((shared_guarded_opt<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
              *)0x30f70f);
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
  ::~shared_guarded_opt
            ((shared_guarded_opt<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
              *)0x30f71d);
  return;
}

Assistant:

ConnectorFederateManager::~ConnectorFederateManager() = default;